

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_14d1f4e::Target::DumpSysroot
          (Value *__return_storage_ptr__,Target *this,string *path)

{
  Value *this_00;
  Value VStack_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&VStack_38,(String *)this);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(this_00,&VStack_38);
  Json::Value::~Value(&VStack_38);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpSysroot(std::string const& path)
{
  Json::Value sysroot = Json::objectValue;
  sysroot["path"] = path;
  return sysroot;
}